

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cpp
# Opt level: O0

string * duckdb::TestDirectoryPath_abi_cxx11_(void)

{
  byte bVar1;
  pointer pFVar2;
  ulong uVar3;
  string *in_RDI;
  int pid;
  string test_directory;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> fs;
  string *path;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined4 local_a8;
  int in_stack_ffffffffffffff5c;
  optional_ptr<duckdb::FileOpener,_true> local_a0;
  string local_98 [32];
  string local_78 [32];
  __pid_t local_58;
  undefined1 local_51;
  optional_ptr<duckdb::FileOpener,_true> local_50;
  optional_ptr<duckdb::FileOpener,_true> local_48 [3];
  string local_30 [48];
  
  duckdb::FileSystem::CreateLocal();
  GetTestDirectory_abi_cxx11_();
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  optional_ptr<duckdb::FileOpener,_true>::optional_ptr(local_48,(FileOpener *)0x0);
  bVar1 = (**(code **)(*(long *)pFVar2 + 0x68))(pFVar2,local_30,local_48[0].ptr);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_50,(FileOpener *)0x0);
    (**(code **)(*(long *)pFVar2 + 0x70))(pFVar2,local_30,local_50.ptr);
  }
  local_51 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)in_RDI,local_30);
  }
  else {
    local_58 = getpid();
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    Catch::clara::std::__cxx11::to_string(in_stack_ffffffffffffff5c);
    duckdb::FileSystem::JoinPath(local_78,(string *)pFVar2);
    std::__cxx11::string::operator=((string *)in_RDI,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
  }
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_a0,(FileOpener *)0x0);
  bVar1 = (**(code **)(*(long *)pFVar2 + 0x68))(pFVar2,in_RDI,local_a0.ptr);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)CONCAT17(bVar1,in_stack_ffffffffffffff10));
    optional_ptr<duckdb::FileOpener,_true>::optional_ptr
              ((optional_ptr<duckdb::FileOpener,_true> *)&local_a8,(FileOpener *)0x0);
    (**(code **)(*(long *)pFVar2 + 0x70))
              (pFVar2,in_RDI,CONCAT44(in_stack_ffffffffffffff5c,local_a8));
  }
  local_51 = 1;
  std::__cxx11::string::~string(local_30);
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::~unique_ptr
            ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *)
             0x7f29ce);
  return in_RDI;
}

Assistant:

string TestDirectoryPath() {
	duckdb::unique_ptr<FileSystem> fs = FileSystem::CreateLocal();
	auto test_directory = GetTestDirectory();
	if (!fs->DirectoryExists(test_directory)) {
		fs->CreateDirectory(test_directory);
	}
	string path;
	if (custom_test_directory.empty()) {
		// add the PID to the test directory - but only if it was not specified explicitly by the user
		auto pid = getpid();
		path = fs->JoinPath(test_directory, to_string(pid));
	} else {
		path = test_directory;
	}
	if (!fs->DirectoryExists(path)) {
		fs->CreateDirectory(path);
	}
	return path;
}